

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  undefined1 (*pauVar3) [16];
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar38;
  float fVar41;
  undefined1 auVar24 [16];
  float fVar44;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar39;
  float fVar42;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar40;
  float fVar43;
  float fVar45;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  float fVar46;
  float fVar47;
  float fVar56;
  float fVar57;
  undefined1 auVar48 [16];
  float fVar58;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar59;
  float fVar60;
  float fVar69;
  float fVar71;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar73;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar70;
  float fVar72;
  float fVar74;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar75;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  vfloat4 b1_1;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar105;
  float fVar106;
  vfloat4 b1;
  float fVar107;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar108 [32];
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  float fVar114;
  float fVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar18 = sVar7 * uVar4;
  lVar19 = sVar7 * (uVar4 + 1);
  lVar20 = sVar7 * (uVar4 + 2);
  lVar17 = sVar7 * (uVar4 + 3);
  fVar22 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar8 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  pcVar9 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar8->super_RawBufferView).stride;
  pauVar1 = (undefined1 (*) [16])(pcVar9 + uVar4 * sVar7);
  auVar32 = *pauVar1;
  pfVar2 = (float *)(pcVar9 + (uVar4 + 1) * sVar7);
  fVar74 = *pfVar2;
  fVar40 = pfVar2[1];
  fVar43 = pfVar2[2];
  fVar45 = pfVar2[3];
  pauVar3 = (undefined1 (*) [16])(pcVar9 + (uVar4 + 2) * sVar7);
  auVar30 = *pauVar3;
  pfVar2 = (float *)(pcVar9 + sVar7 * (uVar4 + 3));
  fVar47 = *pfVar2;
  fVar23 = pfVar2[1];
  fVar39 = pfVar2[2];
  fVar42 = pfVar2[3];
  auVar27 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar18),
                          ZEXT416((uint)(fVar22 * *(float *)(pcVar6 + lVar18 + 0xc))),0x30);
  auVar50 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar19),
                          ZEXT416((uint)(fVar22 * *(float *)(pcVar6 + lVar19 + 0xc))),0x30);
  auVar24 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar20),
                          ZEXT416((uint)(fVar22 * *(float *)(pcVar6 + lVar20 + 0xc))),0x30);
  auVar25 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar17),
                          ZEXT416((uint)(fVar22 * *(float *)(pcVar6 + lVar17 + 0xc))),0x30);
  fVar22 = auVar50._0_4_;
  fVar60 = auVar50._4_4_;
  fVar70 = auVar50._8_4_;
  fVar72 = auVar50._12_4_;
  fVar109 = auVar24._0_4_;
  fVar111 = auVar24._4_4_;
  fVar112 = auVar24._8_4_;
  fVar113 = auVar24._12_4_;
  fVar122 = auVar25._0_4_;
  fVar123 = auVar25._4_4_;
  fVar124 = auVar25._8_4_;
  fVar125 = auVar25._12_4_;
  auVar24._0_4_ = fVar22 * 0.0 + fVar109 * 0.5 + fVar122 * 0.0;
  auVar24._4_4_ = fVar60 * 0.0 + fVar111 * 0.5 + fVar123 * 0.0;
  auVar24._8_4_ = fVar70 * 0.0 + fVar112 * 0.5 + fVar124 * 0.0;
  auVar24._12_4_ = fVar72 * 0.0 + fVar113 * 0.5 + fVar125 * 0.0;
  fVar75 = auVar27._0_4_;
  auVar48._0_4_ = fVar75 * 0.5;
  fVar84 = auVar27._4_4_;
  auVar48._4_4_ = fVar84 * 0.5;
  fVar85 = auVar27._8_4_;
  auVar48._8_4_ = fVar85 * 0.5;
  fVar86 = auVar27._12_4_;
  auVar48._12_4_ = fVar86 * 0.5;
  auVar48 = vsubps_avx(auVar24,auVar48);
  fVar21 = *(float *)*pauVar3 * 0.0;
  fVar38 = *(float *)(*pauVar3 + 4) * 0.0;
  fVar41 = *(float *)(*pauVar3 + 8) * 0.0;
  fVar44 = *(float *)(*pauVar3 + 0xc) * 0.0;
  fVar46 = *(float *)*pauVar1 * -0.0;
  fVar56 = *(float *)(*pauVar1 + 4) * -0.0;
  fVar57 = *(float *)(*pauVar1 + 8) * -0.0;
  fVar58 = *(float *)(*pauVar1 + 0xc) * -0.0;
  auVar25._0_4_ = fVar46 + fVar74 + fVar21 + fVar47 * -0.0;
  auVar25._4_4_ = fVar56 + fVar40 + fVar38 + fVar23 * -0.0;
  auVar25._8_4_ = fVar57 + fVar43 + fVar41 + fVar39 * -0.0;
  auVar25._12_4_ = fVar58 + fVar45 + fVar44 + fVar42 * -0.0;
  auVar24 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar49._0_4_ = auVar24._0_4_ * auVar25._0_4_;
  auVar49._4_4_ = auVar24._4_4_ * auVar25._4_4_;
  auVar49._8_4_ = auVar24._8_4_ * auVar25._8_4_;
  auVar49._12_4_ = auVar24._12_4_ * auVar25._12_4_;
  auVar27 = vshufps_avx(auVar25,auVar25,0xc9);
  fVar102 = auVar48._0_4_;
  auVar26._0_4_ = fVar102 * auVar27._0_4_;
  fVar105 = auVar48._4_4_;
  auVar26._4_4_ = fVar105 * auVar27._4_4_;
  fVar106 = auVar48._8_4_;
  auVar26._8_4_ = fVar106 * auVar27._8_4_;
  fVar107 = auVar48._12_4_;
  auVar26._12_4_ = fVar107 * auVar27._12_4_;
  auVar27 = vsubps_avx(auVar49,auVar26);
  auVar25 = vshufps_avx(auVar27,auVar27,0xc9);
  auVar27 = vdpps_avx(auVar25,auVar25,0x7f);
  fVar59 = auVar27._0_4_;
  auVar76._4_12_ = ZEXT812(0) << 0x20;
  auVar76._0_4_ = fVar59;
  auVar50 = vrsqrtss_avx(auVar76,auVar76);
  fVar69 = auVar50._0_4_;
  auVar121._0_4_ = fVar47 * 0.0 + *(float *)*pauVar3 * 0.5 + fVar74 * 0.0;
  auVar121._4_4_ = fVar23 * 0.0 + *(float *)(*pauVar3 + 4) * 0.5 + fVar40 * 0.0;
  auVar121._8_4_ = fVar39 * 0.0 + *(float *)(*pauVar3 + 8) * 0.5 + fVar43 * 0.0;
  auVar121._12_4_ = fVar42 * 0.0 + *(float *)(*pauVar3 + 0xc) * 0.5 + fVar45 * 0.0;
  auVar115._0_4_ = *(float *)*pauVar1 * 0.5;
  auVar115._4_4_ = *(float *)(*pauVar1 + 4) * 0.5;
  auVar115._8_4_ = *(float *)(*pauVar1 + 8) * 0.5;
  auVar115._12_4_ = *(float *)(*pauVar1 + 0xc) * 0.5;
  auVar50 = vsubps_avx(auVar121,auVar115);
  auVar61._0_4_ = auVar50._0_4_ * auVar24._0_4_;
  auVar61._4_4_ = auVar50._4_4_ * auVar24._4_4_;
  auVar61._8_4_ = auVar50._8_4_ * auVar24._8_4_;
  auVar61._12_4_ = auVar50._12_4_ * auVar24._12_4_;
  auVar50 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar116._0_4_ = fVar102 * auVar50._0_4_;
  auVar116._4_4_ = fVar105 * auVar50._4_4_;
  auVar116._8_4_ = fVar106 * auVar50._8_4_;
  auVar116._12_4_ = fVar107 * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar61,auVar116);
  auVar24 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vdpps_avx(auVar25,auVar24,0x7f);
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  auVar62._0_4_ = auVar27._0_4_ * auVar24._0_4_;
  auVar62._4_4_ = auVar27._4_4_ * auVar24._4_4_;
  auVar62._8_4_ = auVar27._8_4_ * auVar24._8_4_;
  auVar62._12_4_ = auVar27._12_4_ * auVar24._12_4_;
  auVar27 = vshufps_avx(auVar50,auVar50,0);
  auVar117._0_4_ = auVar27._0_4_ * auVar25._0_4_;
  auVar117._4_4_ = auVar27._4_4_ * auVar25._4_4_;
  auVar117._8_4_ = auVar27._8_4_ * auVar25._8_4_;
  auVar117._12_4_ = auVar27._12_4_ * auVar25._12_4_;
  auVar26 = vsubps_avx(auVar62,auVar117);
  auVar27 = vrcpss_avx(auVar76,auVar76);
  auVar27 = ZEXT416((uint)(auVar27._0_4_ * (2.0 - fVar59 * auVar27._0_4_)));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  auVar50 = ZEXT416((uint)(fVar69 * 1.5 - fVar69 * fVar69 * fVar59 * 0.5 * fVar69));
  auVar50 = vshufps_avx(auVar50,auVar50,0);
  fVar59 = auVar25._0_4_ * auVar50._0_4_;
  fVar69 = auVar25._4_4_ * auVar50._4_4_;
  fVar71 = auVar25._8_4_ * auVar50._8_4_;
  fVar73 = auVar25._12_4_ * auVar50._12_4_;
  auVar28._0_4_ = fVar22 + fVar109 * 0.0 + fVar122 * -0.0 + fVar75 * -0.0;
  auVar28._4_4_ = fVar60 + fVar111 * 0.0 + fVar123 * -0.0 + fVar84 * -0.0;
  auVar28._8_4_ = fVar70 + fVar112 * 0.0 + fVar124 * -0.0 + fVar85 * -0.0;
  auVar28._12_4_ = fVar72 + fVar113 * 0.0 + fVar125 * -0.0 + fVar86 * -0.0;
  auVar24 = vshufps_avx(auVar48,auVar48,0xff);
  auVar25 = vshufps_avx(auVar28,auVar28,0xff);
  local_178._0_4_ = auVar25._0_4_ * fVar59;
  local_178._4_4_ = auVar25._4_4_ * fVar69;
  fStack_170 = auVar25._8_4_ * fVar71;
  fStack_16c = auVar25._12_4_ * fVar73;
  fVar114 = auVar24._0_4_ * fVar59 + auVar25._0_4_ * auVar50._0_4_ * auVar26._0_4_ * auVar27._0_4_;
  fVar119 = auVar24._4_4_ * fVar69 + auVar25._4_4_ * auVar50._4_4_ * auVar26._4_4_ * auVar27._4_4_;
  fVar71 = auVar24._8_4_ * fVar71 + auVar25._8_4_ * auVar50._8_4_ * auVar26._8_4_ * auVar27._8_4_;
  fVar73 = auVar24._12_4_ * fVar73 +
           auVar25._12_4_ * auVar50._12_4_ * auVar26._12_4_ * auVar27._12_4_;
  auVar29._0_4_ = fVar109 * 0.0 + fVar122 * 0.5;
  auVar29._4_4_ = fVar111 * 0.0 + fVar123 * 0.5;
  auVar29._8_4_ = fVar112 * 0.0 + fVar124 * 0.5;
  auVar29._12_4_ = fVar113 * 0.0 + fVar125 * 0.5;
  auVar63._0_4_ = fVar22 * 0.5;
  auVar63._4_4_ = fVar60 * 0.5;
  auVar63._8_4_ = fVar70 * 0.5;
  auVar63._12_4_ = fVar72 * 0.5;
  auVar27 = vsubps_avx(auVar29,auVar63);
  auVar51._0_4_ = fVar75 * 0.0 + auVar27._0_4_;
  auVar51._4_4_ = fVar84 * 0.0 + auVar27._4_4_;
  auVar51._8_4_ = fVar85 * 0.0 + auVar27._8_4_;
  auVar51._12_4_ = fVar86 * 0.0 + auVar27._12_4_;
  local_298 = auVar30._0_4_;
  fStack_294 = auVar30._4_4_;
  fStack_290 = auVar30._8_4_;
  fStack_28c = auVar30._12_4_;
  auVar30._0_4_ = fVar74 * 0.0 + local_298 + fVar47 * -0.0 + fVar46;
  auVar30._4_4_ = fVar40 * 0.0 + fStack_294 + fVar23 * -0.0 + fVar56;
  auVar30._8_4_ = fVar43 * 0.0 + fStack_290 + fVar39 * -0.0 + fVar57;
  auVar30._12_4_ = fVar45 * 0.0 + fStack_28c + fVar42 * -0.0 + fVar58;
  auVar24 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar64._0_4_ = auVar24._0_4_ * auVar30._0_4_;
  auVar64._4_4_ = auVar24._4_4_ * auVar30._4_4_;
  auVar64._8_4_ = auVar24._8_4_ * auVar30._8_4_;
  auVar64._12_4_ = auVar24._12_4_ * auVar30._12_4_;
  auVar27 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar31._0_4_ = auVar51._0_4_ * auVar27._0_4_;
  auVar31._4_4_ = auVar51._4_4_ * auVar27._4_4_;
  auVar31._8_4_ = auVar51._8_4_ * auVar27._8_4_;
  auVar31._12_4_ = auVar51._12_4_ * auVar27._12_4_;
  auVar27 = vsubps_avx(auVar64,auVar31);
  auVar25 = vshufps_avx(auVar27,auVar27,0xc9);
  auVar27 = vdpps_avx(auVar25,auVar25,0x7f);
  auVar110._0_4_ = fVar75 * -0.0 + fVar109 + fVar122 * -0.0 + fVar22 * 0.0;
  auVar110._4_4_ = fVar84 * -0.0 + fVar111 + fVar123 * -0.0 + fVar60 * 0.0;
  auVar110._8_4_ = fVar85 * -0.0 + fVar112 + fVar124 * -0.0 + fVar70 * 0.0;
  auVar110._12_4_ = fVar86 * -0.0 + fVar113 + fVar125 * -0.0 + fVar72 * 0.0;
  fVar22 = auVar27._0_4_;
  auVar52._4_12_ = ZEXT812(0) << 0x20;
  auVar52._0_4_ = fVar22;
  auVar50 = vrsqrtss_avx(auVar52,auVar52);
  fVar60 = auVar50._0_4_;
  local_58 = auVar32._0_4_;
  fStack_54 = auVar32._4_4_;
  fStack_50 = auVar32._8_4_;
  fStack_4c = auVar32._12_4_;
  auVar93._0_4_ = fVar47 * 0.5 + fVar21;
  auVar93._4_4_ = fVar23 * 0.5 + fVar38;
  auVar93._8_4_ = fVar39 * 0.5 + fVar41;
  auVar93._12_4_ = fVar42 * 0.5 + fVar44;
  auVar97._0_4_ = fVar74 * 0.5;
  auVar97._4_4_ = fVar40 * 0.5;
  auVar97._8_4_ = fVar43 * 0.5;
  auVar97._12_4_ = fVar45 * 0.5;
  auVar50 = vsubps_avx(auVar93,auVar97);
  auVar87._0_4_ = local_58 * 0.0 + auVar50._0_4_;
  auVar87._4_4_ = fStack_54 * 0.0 + auVar50._4_4_;
  auVar87._8_4_ = fStack_50 * 0.0 + auVar50._8_4_;
  auVar87._12_4_ = fStack_4c * 0.0 + auVar50._12_4_;
  auVar77._0_4_ = auVar24._0_4_ * auVar87._0_4_;
  auVar77._4_4_ = auVar24._4_4_ * auVar87._4_4_;
  auVar77._8_4_ = auVar24._8_4_ * auVar87._8_4_;
  auVar77._12_4_ = auVar24._12_4_ * auVar87._12_4_;
  auVar50 = vshufps_avx(auVar87,auVar87,0xc9);
  auVar88._0_4_ = auVar51._0_4_ * auVar50._0_4_;
  auVar88._4_4_ = auVar51._4_4_ * auVar50._4_4_;
  auVar88._8_4_ = auVar51._8_4_ * auVar50._8_4_;
  auVar88._12_4_ = auVar51._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar77,auVar88);
  auVar24 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vdpps_avx(auVar25,auVar24,0x7f);
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  auVar78._0_4_ = auVar27._0_4_ * auVar24._0_4_;
  auVar78._4_4_ = auVar27._4_4_ * auVar24._4_4_;
  auVar78._8_4_ = auVar27._8_4_ * auVar24._8_4_;
  auVar78._12_4_ = auVar27._12_4_ * auVar24._12_4_;
  auVar27 = vshufps_avx(auVar50,auVar50,0);
  auVar89._0_4_ = auVar27._0_4_ * auVar25._0_4_;
  auVar89._4_4_ = auVar27._4_4_ * auVar25._4_4_;
  auVar89._8_4_ = auVar27._8_4_ * auVar25._8_4_;
  auVar89._12_4_ = auVar27._12_4_ * auVar25._12_4_;
  auVar26 = vsubps_avx(auVar78,auVar89);
  auVar50 = vshufps_avx(auVar110,auVar110,0xff);
  auVar27 = ZEXT416((uint)(fVar60 * 1.5 - fVar22 * 0.5 * fVar60 * fVar60 * fVar60));
  auVar24 = vshufps_avx(auVar27,auVar27,0);
  fVar60 = auVar25._0_4_ * auVar24._0_4_;
  fVar70 = auVar25._4_4_ * auVar24._4_4_;
  fVar72 = auVar25._8_4_ * auVar24._8_4_;
  fVar74 = auVar25._12_4_ * auVar24._12_4_;
  auVar27 = vrcpss_avx(auVar52,auVar52);
  auVar25 = vshufps_avx(auVar51,auVar51,0xff);
  local_d8._0_4_ = auVar50._0_4_ * fVar60;
  local_d8._4_4_ = auVar50._4_4_ * fVar70;
  fStack_d0 = auVar50._8_4_ * fVar72;
  fStack_cc = auVar50._12_4_ * fVar74;
  auVar53._0_4_ = auVar110._0_4_ + (float)local_d8._0_4_;
  auVar53._4_4_ = auVar110._4_4_ + (float)local_d8._4_4_;
  auVar53._8_4_ = auVar110._8_4_ + fStack_d0;
  auVar53._12_4_ = auVar110._12_4_ + fStack_cc;
  auVar27 = ZEXT416((uint)(auVar27._0_4_ * (2.0 - fVar22 * auVar27._0_4_)));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  fVar23 = auVar25._0_4_ * fVar60 + auVar50._0_4_ * auVar24._0_4_ * auVar26._0_4_ * auVar27._0_4_;
  fVar39 = auVar25._4_4_ * fVar70 + auVar50._4_4_ * auVar24._4_4_ * auVar26._4_4_ * auVar27._4_4_;
  fVar42 = auVar25._8_4_ * fVar72 + auVar50._8_4_ * auVar24._8_4_ * auVar26._8_4_ * auVar27._8_4_;
  fVar21 = auVar25._12_4_ * fVar74 +
           auVar50._12_4_ * auVar24._12_4_ * auVar26._12_4_ * auVar27._12_4_;
  auVar32._0_4_ = (auVar51._0_4_ + fVar23) * 0.33333334;
  auVar32._4_4_ = (auVar51._4_4_ + fVar39) * 0.33333334;
  auVar32._8_4_ = (auVar51._8_4_ + fVar42) * 0.33333334;
  auVar32._12_4_ = (auVar51._12_4_ + fVar21) * 0.33333334;
  auVar24 = vsubps_avx(auVar53,auVar32);
  auVar27 = vshufps_avx(auVar24,auVar24,0xaa);
  fVar22 = auVar27._0_4_;
  fVar70 = auVar27._4_4_;
  fVar74 = auVar27._8_4_;
  fVar43 = auVar27._12_4_;
  auVar27 = vshufps_avx(auVar53,auVar53,0xaa);
  fVar60 = auVar27._0_4_;
  fVar72 = auVar27._4_4_;
  fVar40 = auVar27._8_4_;
  fVar45 = auVar27._12_4_;
  auVar94._0_4_ = (float)local_178._0_4_ + auVar28._0_4_;
  auVar94._4_4_ = (float)local_178._4_4_ + auVar28._4_4_;
  auVar94._8_4_ = fStack_170 + auVar28._8_4_;
  auVar94._12_4_ = fStack_16c + auVar28._12_4_;
  auVar98._0_4_ = auVar94._0_4_ + (fVar114 + fVar102) * 0.33333334;
  auVar98._4_4_ = auVar94._4_4_ + (fVar119 + fVar105) * 0.33333334;
  auVar98._8_4_ = auVar94._8_4_ + (fVar71 + fVar106) * 0.33333334;
  auVar98._12_4_ = auVar94._12_4_ + (fVar73 + fVar107) * 0.33333334;
  auVar27 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar47 = auVar27._0_4_;
  fVar59 = auVar27._4_4_;
  fVar38 = auVar27._8_4_;
  auVar50 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar41 = auVar50._0_4_;
  fVar44 = auVar50._4_4_;
  fVar46 = auVar50._8_4_;
  fVar69 = auVar50._12_4_;
  auVar91._0_4_ =
       fVar41 * (float)bezier_basis0._476_4_ +
       fVar47 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar22 + (float)bezier_basis0._3944_4_ * fVar60;
  auVar91._4_4_ =
       fVar44 * (float)bezier_basis0._480_4_ +
       fVar59 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar70 + (float)bezier_basis0._3948_4_ * fVar72;
  auVar91._8_4_ =
       fVar46 * (float)bezier_basis0._484_4_ +
       fVar38 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar74 + (float)bezier_basis0._3952_4_ * fVar40;
  auVar91._12_4_ =
       fVar69 * (float)bezier_basis0._488_4_ +
       auVar27._12_4_ * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar43 + (float)bezier_basis0._3956_4_ * fVar45;
  auVar91._16_4_ =
       fVar41 * (float)bezier_basis0._492_4_ +
       fVar47 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar22 + (float)bezier_basis0._3960_4_ * fVar60;
  auVar91._20_4_ =
       fVar44 * (float)bezier_basis0._496_4_ +
       fVar59 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar70 + (float)bezier_basis0._3964_4_ * fVar72;
  auVar91._24_4_ =
       fVar46 * (float)bezier_basis0._500_4_ +
       fVar38 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar74 + (float)bezier_basis0._3968_4_ * fVar40;
  auVar91._28_4_ = 0;
  auVar33._0_4_ =
       fVar41 * (float)bezier_basis0._5100_4_ +
       fVar47 * (float)bezier_basis0._6256_4_ +
       fVar22 * (float)bezier_basis0._7412_4_ + fVar60 * (float)bezier_basis0._8568_4_;
  auVar33._4_4_ =
       fVar44 * (float)bezier_basis0._5104_4_ +
       fVar59 * (float)bezier_basis0._6260_4_ +
       fVar70 * (float)bezier_basis0._7416_4_ + fVar72 * (float)bezier_basis0._8572_4_;
  auVar33._8_4_ =
       fVar46 * (float)bezier_basis0._5108_4_ +
       fVar38 * (float)bezier_basis0._6264_4_ +
       fVar74 * (float)bezier_basis0._7420_4_ + fVar40 * (float)bezier_basis0._8576_4_;
  auVar33._12_4_ =
       fVar69 * (float)bezier_basis0._5112_4_ +
       auVar27._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar43 * (float)bezier_basis0._7424_4_ + fVar45 * (float)bezier_basis0._8580_4_;
  auVar33._16_4_ =
       fVar41 * (float)bezier_basis0._5116_4_ +
       fVar47 * (float)bezier_basis0._6272_4_ +
       fVar22 * (float)bezier_basis0._7428_4_ + fVar60 * (float)bezier_basis0._8584_4_;
  auVar33._20_4_ =
       fVar44 * (float)bezier_basis0._5120_4_ +
       fVar59 * (float)bezier_basis0._6276_4_ +
       fVar70 * (float)bezier_basis0._7432_4_ + fVar72 * (float)bezier_basis0._8588_4_;
  auVar33._24_4_ =
       fVar46 * (float)bezier_basis0._5124_4_ +
       fVar38 * (float)bezier_basis0._6280_4_ +
       fVar74 * (float)bezier_basis0._7436_4_ + fVar40 * (float)bezier_basis0._8592_4_;
  auVar33._28_4_ = fVar45 + fVar45 + fVar43 + fVar45;
  auVar34 = vblendps_avx(auVar33,ZEXT832(0) << 0x20,1);
  auVar10._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar10._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar10._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar10._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar10._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar10._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar10._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar10._28_4_ = auVar34._28_4_;
  auVar14 = vsubps_avx(auVar91,auVar10);
  auVar34 = vblendps_avx(auVar33,ZEXT832(0) << 0x20,0x80);
  auVar80._0_4_ = auVar91._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar80._4_4_ = auVar91._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar80._8_4_ = auVar91._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar80._12_4_ = auVar91._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar80._16_4_ = auVar91._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar80._20_4_ = auVar91._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar80._24_4_ = auVar91._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar80._28_4_ = auVar34._28_4_ + 0.0;
  auVar34._8_4_ = 0xff800000;
  auVar34._0_8_ = 0xff800000ff800000;
  auVar34._12_4_ = 0xff800000;
  auVar34._16_4_ = 0xff800000;
  auVar34._20_4_ = 0xff800000;
  auVar34._24_4_ = 0xff800000;
  auVar34._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar34,auVar91);
  auVar10 = vmaxps_avx(auVar14,auVar80);
  auVar33 = vmaxps_avx(auVar34,auVar10);
  auVar27 = vshufps_avx(auVar24,auVar24,0x55);
  auVar50 = vshufps_avx(auVar53,auVar53,0x55);
  fVar22 = auVar27._0_4_;
  fVar60 = auVar27._4_4_;
  fVar70 = auVar27._8_4_;
  fVar72 = auVar27._12_4_;
  fVar74 = auVar50._0_4_;
  fVar40 = auVar50._4_4_;
  fVar43 = auVar50._8_4_;
  fVar45 = auVar50._12_4_;
  auVar27 = vshufps_avx(auVar98,auVar98,0x55);
  fVar41 = auVar27._0_4_;
  fVar44 = auVar27._4_4_;
  fVar46 = auVar27._8_4_;
  auVar50 = vshufps_avx(auVar94,auVar94,0x55);
  fVar47 = auVar50._0_4_;
  fVar59 = auVar50._4_4_;
  fVar38 = auVar50._8_4_;
  auVar108._0_4_ =
       fVar47 * (float)bezier_basis0._476_4_ +
       fVar41 * (float)bezier_basis0._1632_4_ +
       fVar74 * (float)bezier_basis0._3944_4_ + (float)bezier_basis0._2788_4_ * fVar22;
  auVar108._4_4_ =
       fVar59 * (float)bezier_basis0._480_4_ +
       fVar44 * (float)bezier_basis0._1636_4_ +
       fVar40 * (float)bezier_basis0._3948_4_ + (float)bezier_basis0._2792_4_ * fVar60;
  auVar108._8_4_ =
       fVar38 * (float)bezier_basis0._484_4_ +
       fVar46 * (float)bezier_basis0._1640_4_ +
       fVar43 * (float)bezier_basis0._3952_4_ + (float)bezier_basis0._2796_4_ * fVar70;
  auVar108._12_4_ =
       auVar50._12_4_ * (float)bezier_basis0._488_4_ +
       auVar27._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar45 * (float)bezier_basis0._3956_4_ + (float)bezier_basis0._2800_4_ * fVar72;
  auVar108._16_4_ =
       fVar47 * (float)bezier_basis0._492_4_ +
       fVar41 * (float)bezier_basis0._1648_4_ +
       fVar74 * (float)bezier_basis0._3960_4_ + (float)bezier_basis0._2804_4_ * fVar22;
  auVar108._20_4_ =
       fVar59 * (float)bezier_basis0._496_4_ +
       fVar44 * (float)bezier_basis0._1652_4_ +
       fVar40 * (float)bezier_basis0._3964_4_ + (float)bezier_basis0._2808_4_ * fVar60;
  auVar108._24_4_ =
       fVar38 * (float)bezier_basis0._500_4_ +
       fVar46 * (float)bezier_basis0._1656_4_ +
       fVar43 * (float)bezier_basis0._3968_4_ + (float)bezier_basis0._2812_4_ * fVar70;
  auVar108._28_4_ = (float)bezier_basis0._2816_4_ + auVar14._28_4_ + fVar69 + 0.0;
  auVar66._0_4_ =
       fVar47 * (float)bezier_basis0._5100_4_ +
       fVar41 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar22 + (float)bezier_basis0._8568_4_ * fVar74;
  auVar66._4_4_ =
       fVar59 * (float)bezier_basis0._5104_4_ +
       fVar44 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar60 + (float)bezier_basis0._8572_4_ * fVar40;
  auVar66._8_4_ =
       fVar38 * (float)bezier_basis0._5108_4_ +
       fVar46 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar70 + (float)bezier_basis0._8576_4_ * fVar43;
  auVar66._12_4_ =
       auVar50._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar27._12_4_ * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar72 + (float)bezier_basis0._8580_4_ * fVar45;
  auVar66._16_4_ =
       fVar47 * (float)bezier_basis0._5116_4_ +
       fVar41 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar22 + (float)bezier_basis0._8584_4_ * fVar74;
  auVar66._20_4_ =
       fVar59 * (float)bezier_basis0._5120_4_ +
       fVar44 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar60 + (float)bezier_basis0._8588_4_ * fVar40;
  auVar66._24_4_ =
       fVar38 * (float)bezier_basis0._5124_4_ +
       fVar46 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar70 + (float)bezier_basis0._8592_4_ * fVar43;
  auVar66._28_4_ = fVar45 + fVar45 + fVar72 + fVar45;
  auVar34 = vblendps_avx(auVar66,ZEXT832(0) << 0x20,1);
  auVar11._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar11._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar11._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar11._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar11._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar11._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar11._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar11._28_4_ = auVar34._28_4_;
  auVar15 = vsubps_avx(auVar108,auVar11);
  auVar34 = vblendps_avx(auVar66,ZEXT832(0) << 0x20,0x80);
  auVar67._0_4_ = auVar108._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar67._4_4_ = auVar108._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar67._8_4_ = auVar108._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar67._12_4_ = auVar108._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar67._16_4_ = auVar108._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar67._20_4_ = auVar108._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar67._24_4_ = auVar108._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar67._28_4_ = auVar108._28_4_ + auVar34._28_4_;
  auVar90._8_4_ = 0xff800000;
  auVar90._0_8_ = 0xff800000ff800000;
  auVar90._12_4_ = 0xff800000;
  auVar90._16_4_ = 0xff800000;
  auVar90._20_4_ = 0xff800000;
  auVar90._24_4_ = 0xff800000;
  auVar90._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar90,auVar108);
  auVar10 = vmaxps_avx(auVar15,auVar67);
  auVar11 = vmaxps_avx(auVar34,auVar10);
  auVar27 = vpermilps_avx(auVar24,0);
  auVar50 = vpermilps_avx(auVar53,0);
  fVar22 = auVar27._0_4_;
  fVar70 = auVar27._4_4_;
  fVar74 = auVar27._8_4_;
  fVar43 = auVar27._12_4_;
  fVar59 = auVar50._0_4_;
  fVar38 = auVar50._4_4_;
  fVar41 = auVar50._8_4_;
  fVar44 = auVar50._12_4_;
  fVar47 = auVar10._28_4_;
  auVar27 = vpermilps_avx(auVar98,0);
  fVar46 = auVar27._0_4_;
  fVar69 = auVar27._4_4_;
  fVar56 = auVar27._8_4_;
  fVar57 = auVar27._12_4_;
  auVar27 = vpermilps_avx(auVar94,0);
  fVar60 = auVar27._0_4_;
  fVar72 = auVar27._4_4_;
  fVar40 = auVar27._8_4_;
  fVar45 = auVar27._12_4_;
  auVar103._0_4_ =
       (float)bezier_basis0._476_4_ * fVar60 +
       fVar46 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar22 + fVar59 * (float)bezier_basis0._3944_4_;
  auVar103._4_4_ =
       (float)bezier_basis0._480_4_ * fVar72 +
       fVar69 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar70 + fVar38 * (float)bezier_basis0._3948_4_;
  auVar103._8_4_ =
       (float)bezier_basis0._484_4_ * fVar40 +
       fVar56 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar74 + fVar41 * (float)bezier_basis0._3952_4_;
  auVar103._12_4_ =
       (float)bezier_basis0._488_4_ * fVar45 +
       fVar57 * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar43 + fVar44 * (float)bezier_basis0._3956_4_;
  auVar103._16_4_ =
       (float)bezier_basis0._492_4_ * fVar60 +
       fVar46 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar22 + fVar59 * (float)bezier_basis0._3960_4_;
  auVar103._20_4_ =
       (float)bezier_basis0._496_4_ * fVar72 +
       fVar69 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar70 + fVar38 * (float)bezier_basis0._3964_4_;
  auVar103._24_4_ =
       (float)bezier_basis0._500_4_ * fVar40 +
       fVar56 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar74 + fVar41 * (float)bezier_basis0._3968_4_;
  auVar103._28_4_ = fVar47 + fVar47 + auVar11._28_4_ + fVar47;
  auVar54._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar60 +
       (float)bezier_basis0._6256_4_ * fVar46 +
       fVar22 * (float)bezier_basis0._7412_4_ + (float)bezier_basis0._8568_4_ * fVar59;
  auVar54._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar72 +
       (float)bezier_basis0._6260_4_ * fVar69 +
       fVar70 * (float)bezier_basis0._7416_4_ + (float)bezier_basis0._8572_4_ * fVar38;
  auVar54._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar40 +
       (float)bezier_basis0._6264_4_ * fVar56 +
       fVar74 * (float)bezier_basis0._7420_4_ + (float)bezier_basis0._8576_4_ * fVar41;
  auVar54._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar45 +
       (float)bezier_basis0._6268_4_ * fVar57 +
       fVar43 * (float)bezier_basis0._7424_4_ + (float)bezier_basis0._8580_4_ * fVar44;
  auVar54._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar60 +
       (float)bezier_basis0._6272_4_ * fVar46 +
       fVar22 * (float)bezier_basis0._7428_4_ + (float)bezier_basis0._8584_4_ * fVar59;
  auVar54._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar72 +
       (float)bezier_basis0._6276_4_ * fVar69 +
       fVar70 * (float)bezier_basis0._7432_4_ + (float)bezier_basis0._8588_4_ * fVar38;
  auVar54._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar40 +
       (float)bezier_basis0._6280_4_ * fVar56 +
       fVar74 * (float)bezier_basis0._7436_4_ + (float)bezier_basis0._8592_4_ * fVar41;
  auVar54._28_4_ = fVar45 + fVar57 + fVar43 + fVar44;
  auVar34 = vblendps_avx(auVar54,ZEXT432(0) << 0x20,1);
  auVar12._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar12._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar12._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar12._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar12._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar12._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar12._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar12._28_4_ = auVar34._28_4_;
  auVar90 = vsubps_avx(auVar103,auVar12);
  auVar34 = vblendps_avx(auVar54,ZEXT432(0) << 0x20,0x80);
  auVar55._0_4_ = auVar103._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar55._4_4_ = auVar103._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar55._8_4_ = auVar103._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar55._12_4_ = auVar103._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar55._16_4_ = auVar103._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar55._20_4_ = auVar103._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar55._24_4_ = auVar103._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar55._28_4_ = auVar103._28_4_ + auVar34._28_4_;
  auVar92._8_4_ = 0xff800000;
  auVar92._0_8_ = 0xff800000ff800000;
  auVar92._12_4_ = 0xff800000;
  auVar92._16_4_ = 0xff800000;
  auVar92._20_4_ = 0xff800000;
  auVar92._24_4_ = 0xff800000;
  auVar92._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar92,auVar103);
  auVar10 = vmaxps_avx(auVar90,auVar55);
  auVar12 = vmaxps_avx(auVar34,auVar10);
  auVar34 = vminps_avx(auVar14,auVar80);
  auVar99._8_4_ = 0x7f800000;
  auVar99._0_8_ = 0x7f8000007f800000;
  auVar99._12_4_ = 0x7f800000;
  auVar99._16_4_ = 0x7f800000;
  auVar99._20_4_ = 0x7f800000;
  auVar99._24_4_ = 0x7f800000;
  auVar99._28_4_ = 0x7f800000;
  auVar10 = vminps_avx(auVar99,auVar91);
  auVar54 = vminps_avx(auVar10,auVar34);
  auVar10 = vminps_avx(auVar15,auVar67);
  auVar14 = vminps_avx(auVar99,auVar108);
  auVar66 = vminps_avx(auVar14,auVar10);
  auVar10 = vminps_avx(auVar90,auVar55);
  auVar14 = vminps_avx(auVar99,auVar103);
  auVar90 = vminps_avx(auVar14,auVar10);
  auVar25 = vsubps_avx(auVar28,_local_178);
  auVar27._4_4_ = fVar119;
  auVar27._0_4_ = fVar114;
  auVar27._8_4_ = fVar71;
  auVar27._12_4_ = fVar73;
  auVar24 = vsubps_avx(auVar48,auVar27);
  auVar48 = vsubps_avx(auVar110,_local_d8);
  auVar50._4_4_ = fVar39;
  auVar50._0_4_ = fVar23;
  auVar50._8_4_ = fVar42;
  auVar50._12_4_ = fVar21;
  auVar27 = vsubps_avx(auVar51,auVar50);
  auVar79._0_4_ = auVar27._0_4_ * 0.33333334;
  auVar79._4_4_ = auVar27._4_4_ * 0.33333334;
  auVar79._8_4_ = auVar27._8_4_ * 0.33333334;
  auVar79._12_4_ = auVar27._12_4_ * 0.33333334;
  auVar26 = vsubps_avx(auVar48,auVar79);
  auVar27 = vshufps_avx(auVar26,auVar26,0xaa);
  auVar50 = vshufps_avx(auVar48,auVar48,0xaa);
  fVar22 = auVar27._0_4_;
  fVar72 = auVar27._4_4_;
  fVar43 = auVar27._8_4_;
  fVar23 = auVar27._12_4_;
  fVar60 = auVar50._0_4_;
  fVar74 = auVar50._4_4_;
  fVar45 = auVar50._8_4_;
  fVar39 = auVar50._12_4_;
  auVar120._0_4_ = auVar25._0_4_ + auVar24._0_4_ * 0.33333334;
  auVar120._4_4_ = auVar25._4_4_ + auVar24._4_4_ * 0.33333334;
  auVar120._8_4_ = auVar25._8_4_ + auVar24._8_4_ * 0.33333334;
  auVar120._12_4_ = auVar25._12_4_ + auVar24._12_4_ * 0.33333334;
  auVar27 = vshufps_avx(auVar120,auVar120,0xaa);
  fVar70 = auVar27._0_4_;
  fVar40 = auVar27._4_4_;
  fVar47 = auVar27._8_4_;
  auVar50 = vshufps_avx(auVar25,auVar25,0xaa);
  fVar42 = auVar50._0_4_;
  fVar21 = auVar50._4_4_;
  fVar59 = auVar50._8_4_;
  auVar100._0_4_ =
       fVar42 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar70 +
       (float)bezier_basis0._2788_4_ * fVar22 + (float)bezier_basis0._3944_4_ * fVar60;
  auVar100._4_4_ =
       fVar21 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar40 +
       (float)bezier_basis0._2792_4_ * fVar72 + (float)bezier_basis0._3948_4_ * fVar74;
  auVar100._8_4_ =
       fVar59 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar47 +
       (float)bezier_basis0._2796_4_ * fVar43 + (float)bezier_basis0._3952_4_ * fVar45;
  auVar100._12_4_ =
       auVar50._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * auVar27._12_4_ +
       (float)bezier_basis0._2800_4_ * fVar23 + (float)bezier_basis0._3956_4_ * fVar39;
  auVar100._16_4_ =
       fVar42 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar70 +
       (float)bezier_basis0._2804_4_ * fVar22 + (float)bezier_basis0._3960_4_ * fVar60;
  auVar100._20_4_ =
       fVar21 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar40 +
       (float)bezier_basis0._2808_4_ * fVar72 + (float)bezier_basis0._3964_4_ * fVar74;
  auVar100._24_4_ =
       fVar59 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar47 +
       (float)bezier_basis0._2812_4_ * fVar43 + (float)bezier_basis0._3968_4_ * fVar45;
  auVar100._28_4_ = (float)bezier_basis0._8596_4_ + auVar54._28_4_ + auVar34._28_4_ + INFINITY;
  auVar81._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar42 +
       fVar70 * (float)bezier_basis0._6256_4_ +
       fVar22 * (float)bezier_basis0._7412_4_ + fVar60 * (float)bezier_basis0._8568_4_;
  auVar81._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar21 +
       fVar40 * (float)bezier_basis0._6260_4_ +
       fVar72 * (float)bezier_basis0._7416_4_ + fVar74 * (float)bezier_basis0._8572_4_;
  auVar81._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar59 +
       fVar47 * (float)bezier_basis0._6264_4_ +
       fVar43 * (float)bezier_basis0._7420_4_ + fVar45 * (float)bezier_basis0._8576_4_;
  auVar81._12_4_ =
       (float)bezier_basis0._5112_4_ * auVar50._12_4_ +
       auVar27._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar23 * (float)bezier_basis0._7424_4_ + fVar39 * (float)bezier_basis0._8580_4_;
  auVar81._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar42 +
       fVar70 * (float)bezier_basis0._6272_4_ +
       fVar22 * (float)bezier_basis0._7428_4_ + fVar60 * (float)bezier_basis0._8584_4_;
  auVar81._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar21 +
       fVar40 * (float)bezier_basis0._6276_4_ +
       fVar72 * (float)bezier_basis0._7432_4_ + fVar74 * (float)bezier_basis0._8588_4_;
  auVar81._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar59 +
       fVar47 * (float)bezier_basis0._6280_4_ +
       fVar43 * (float)bezier_basis0._7436_4_ + fVar45 * (float)bezier_basis0._8592_4_;
  auVar81._28_4_ = fVar39 + fVar39 + fVar23 + fVar39;
  auVar34 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,1);
  auVar14._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar14._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar14._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar14._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar14._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar14._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar14._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar14._28_4_ = auVar34._28_4_;
  auVar55 = vsubps_avx(auVar100,auVar14);
  auVar34 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  auVar95._0_4_ = auVar100._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar95._4_4_ = auVar100._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar95._8_4_ = auVar100._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar95._12_4_ = auVar100._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar95._16_4_ = auVar100._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar95._20_4_ = auVar100._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar95._24_4_ = auVar100._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar95._28_4_ = auVar100._28_4_ + auVar34._28_4_;
  auVar82._8_4_ = 0xff800000;
  auVar82._0_8_ = 0xff800000ff800000;
  auVar82._12_4_ = 0xff800000;
  auVar82._16_4_ = 0xff800000;
  auVar82._20_4_ = 0xff800000;
  auVar82._24_4_ = 0xff800000;
  auVar82._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar82,auVar100);
  auVar10 = vmaxps_avx(auVar55,auVar95);
  auVar14 = vmaxps_avx(auVar34,auVar10);
  auVar27 = vshufps_avx(auVar26,auVar26,0x55);
  auVar50 = vshufps_avx(auVar48,auVar48,0x55);
  fVar22 = auVar27._0_4_;
  fVar70 = auVar27._4_4_;
  fVar74 = auVar27._8_4_;
  fVar43 = auVar27._12_4_;
  fVar60 = auVar50._0_4_;
  fVar72 = auVar50._4_4_;
  fVar40 = auVar50._8_4_;
  auVar27 = vshufps_avx(auVar120,auVar120,0x55);
  fVar47 = auVar27._0_4_;
  fVar23 = auVar27._4_4_;
  fVar39 = auVar27._8_4_;
  auVar24 = vshufps_avx(auVar25,auVar25,0x55);
  fVar42 = auVar24._0_4_;
  fVar21 = auVar24._4_4_;
  fVar59 = auVar24._8_4_;
  fVar44 = auVar24._12_4_;
  fVar45 = auVar55._28_4_;
  auVar96._0_4_ =
       fVar42 * (float)bezier_basis0._476_4_ +
       fVar47 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._3944_4_ * fVar60 + (float)bezier_basis0._2788_4_ * fVar22;
  auVar96._4_4_ =
       fVar21 * (float)bezier_basis0._480_4_ +
       fVar23 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._3948_4_ * fVar72 + (float)bezier_basis0._2792_4_ * fVar70;
  auVar96._8_4_ =
       fVar59 * (float)bezier_basis0._484_4_ +
       fVar39 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._3952_4_ * fVar40 + (float)bezier_basis0._2796_4_ * fVar74;
  auVar96._12_4_ =
       fVar44 * (float)bezier_basis0._488_4_ +
       auVar27._12_4_ * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._3956_4_ * auVar50._12_4_ + (float)bezier_basis0._2800_4_ * fVar43;
  auVar96._16_4_ =
       fVar42 * (float)bezier_basis0._492_4_ +
       fVar47 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._3960_4_ * fVar60 + (float)bezier_basis0._2804_4_ * fVar22;
  auVar96._20_4_ =
       fVar21 * (float)bezier_basis0._496_4_ +
       fVar23 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._3964_4_ * fVar72 + (float)bezier_basis0._2808_4_ * fVar70;
  auVar96._24_4_ =
       fVar59 * (float)bezier_basis0._500_4_ +
       fVar39 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._3968_4_ * fVar40 + (float)bezier_basis0._2812_4_ * fVar74;
  auVar96._28_4_ = fVar45 + (float)bezier_basis0._3972_4_ + auVar100._28_4_ + 0.0;
  auVar83._0_4_ =
       fVar42 * (float)bezier_basis0._5100_4_ +
       fVar47 * (float)bezier_basis0._6256_4_ +
       fVar22 * (float)bezier_basis0._7412_4_ + fVar60 * (float)bezier_basis0._8568_4_;
  auVar83._4_4_ =
       fVar21 * (float)bezier_basis0._5104_4_ +
       fVar23 * (float)bezier_basis0._6260_4_ +
       fVar70 * (float)bezier_basis0._7416_4_ + fVar72 * (float)bezier_basis0._8572_4_;
  auVar83._8_4_ =
       fVar59 * (float)bezier_basis0._5108_4_ +
       fVar39 * (float)bezier_basis0._6264_4_ +
       fVar74 * (float)bezier_basis0._7420_4_ + fVar40 * (float)bezier_basis0._8576_4_;
  auVar83._12_4_ =
       fVar44 * (float)bezier_basis0._5112_4_ +
       auVar27._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar43 * (float)bezier_basis0._7424_4_ + auVar50._12_4_ * (float)bezier_basis0._8580_4_;
  auVar83._16_4_ =
       fVar42 * (float)bezier_basis0._5116_4_ +
       fVar47 * (float)bezier_basis0._6272_4_ +
       fVar22 * (float)bezier_basis0._7428_4_ + fVar60 * (float)bezier_basis0._8584_4_;
  auVar83._20_4_ =
       fVar21 * (float)bezier_basis0._5120_4_ +
       fVar23 * (float)bezier_basis0._6276_4_ +
       fVar70 * (float)bezier_basis0._7432_4_ + fVar72 * (float)bezier_basis0._8588_4_;
  auVar83._24_4_ =
       fVar59 * (float)bezier_basis0._5124_4_ +
       fVar39 * (float)bezier_basis0._6280_4_ +
       fVar74 * (float)bezier_basis0._7436_4_ + fVar40 * (float)bezier_basis0._8592_4_;
  auVar83._28_4_ = fVar45 + fVar45 + fVar43 + fVar45;
  auVar34 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,1);
  auVar15._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar34._28_4_;
  auVar67 = vsubps_avx(auVar96,auVar15);
  auVar34 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  auVar101._0_4_ = auVar96._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar101._4_4_ = auVar96._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar101._8_4_ = auVar96._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar101._12_4_ = auVar96._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar101._16_4_ = auVar96._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar101._20_4_ = auVar96._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar101._24_4_ = auVar96._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar101._28_4_ = auVar96._28_4_ + auVar34._28_4_;
  auVar35._8_4_ = 0xff800000;
  auVar35._0_8_ = 0xff800000ff800000;
  auVar35._12_4_ = 0xff800000;
  auVar35._16_4_ = 0xff800000;
  auVar35._20_4_ = 0xff800000;
  auVar35._24_4_ = 0xff800000;
  auVar35._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar35,auVar96);
  auVar10 = vmaxps_avx(auVar67,auVar101);
  auVar15 = vmaxps_avx(auVar34,auVar10);
  auVar27 = vshufps_avx(auVar26,auVar26,0);
  fVar22 = auVar27._0_4_;
  fVar60 = auVar27._4_4_;
  fVar70 = auVar27._8_4_;
  fVar72 = auVar27._12_4_;
  auVar27 = vshufps_avx(auVar48,auVar48,0);
  fVar21 = auVar27._0_4_;
  fVar59 = auVar27._4_4_;
  fVar38 = auVar27._8_4_;
  fVar41 = auVar27._12_4_;
  auVar27 = vshufps_avx(auVar120,auVar120,0);
  fVar74 = auVar27._0_4_;
  fVar40 = auVar27._4_4_;
  fVar43 = auVar27._8_4_;
  fVar45 = auVar27._12_4_;
  auVar27 = vshufps_avx(auVar25,auVar25,0);
  fVar47 = auVar27._0_4_;
  fVar23 = auVar27._4_4_;
  fVar39 = auVar27._8_4_;
  fVar42 = auVar27._12_4_;
  auVar104._0_4_ =
       fVar47 * (float)bezier_basis0._476_4_ +
       fVar74 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar22 + fVar21 * (float)bezier_basis0._3944_4_;
  auVar104._4_4_ =
       fVar23 * (float)bezier_basis0._480_4_ +
       fVar40 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar60 + fVar59 * (float)bezier_basis0._3948_4_;
  auVar104._8_4_ =
       fVar39 * (float)bezier_basis0._484_4_ +
       fVar43 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar70 + fVar38 * (float)bezier_basis0._3952_4_;
  auVar104._12_4_ =
       fVar42 * (float)bezier_basis0._488_4_ +
       fVar45 * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar72 + fVar41 * (float)bezier_basis0._3956_4_;
  auVar104._16_4_ =
       fVar47 * (float)bezier_basis0._492_4_ +
       fVar74 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar22 + fVar21 * (float)bezier_basis0._3960_4_;
  auVar104._20_4_ =
       fVar23 * (float)bezier_basis0._496_4_ +
       fVar40 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar60 + fVar59 * (float)bezier_basis0._3964_4_;
  auVar104._24_4_ =
       fVar39 * (float)bezier_basis0._500_4_ +
       fVar43 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar70 + fVar38 * (float)bezier_basis0._3968_4_;
  auVar104._28_4_ = fVar44 + (float)bezier_basis0._2816_4_ + fVar44 + 0.0;
  auVar36._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar47 +
       fVar74 * (float)bezier_basis0._6256_4_ +
       fVar22 * (float)bezier_basis0._7412_4_ + fVar21 * (float)bezier_basis0._8568_4_;
  auVar36._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar23 +
       fVar40 * (float)bezier_basis0._6260_4_ +
       fVar60 * (float)bezier_basis0._7416_4_ + fVar59 * (float)bezier_basis0._8572_4_;
  auVar36._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar39 +
       fVar43 * (float)bezier_basis0._6264_4_ +
       fVar70 * (float)bezier_basis0._7420_4_ + fVar38 * (float)bezier_basis0._8576_4_;
  auVar36._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar42 +
       fVar45 * (float)bezier_basis0._6268_4_ +
       fVar72 * (float)bezier_basis0._7424_4_ + fVar41 * (float)bezier_basis0._8580_4_;
  auVar36._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar47 +
       fVar74 * (float)bezier_basis0._6272_4_ +
       fVar22 * (float)bezier_basis0._7428_4_ + fVar21 * (float)bezier_basis0._8584_4_;
  auVar36._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar23 +
       fVar40 * (float)bezier_basis0._6276_4_ +
       fVar60 * (float)bezier_basis0._7432_4_ + fVar59 * (float)bezier_basis0._8588_4_;
  auVar36._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar39 +
       fVar43 * (float)bezier_basis0._6280_4_ +
       fVar70 * (float)bezier_basis0._7436_4_ + fVar38 * (float)bezier_basis0._8592_4_;
  auVar36._28_4_ = fVar42 + fVar45 + fVar72 + fVar41;
  auVar34 = vblendps_avx(auVar36,ZEXT432(0) << 0x20,1);
  auVar10 = vblendps_avx(auVar36,ZEXT432(0) << 0x20,0x80);
  auVar16._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar16._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar16._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar16._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar16._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar16._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar16._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar16._28_4_ = auVar34._28_4_;
  auVar68._8_4_ = 0xff800000;
  auVar68._0_8_ = 0xff800000ff800000;
  auVar68._12_4_ = 0xff800000;
  auVar68._16_4_ = 0xff800000;
  auVar68._20_4_ = 0xff800000;
  auVar68._24_4_ = 0xff800000;
  auVar68._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar68,auVar104);
  auVar16 = vsubps_avx(auVar104,auVar16);
  auVar37._0_4_ = auVar104._0_4_ + auVar10._0_4_ * 0.055555556;
  auVar37._4_4_ = auVar104._4_4_ + auVar10._4_4_ * 0.055555556;
  auVar37._8_4_ = auVar104._8_4_ + auVar10._8_4_ * 0.055555556;
  auVar37._12_4_ = auVar104._12_4_ + auVar10._12_4_ * 0.055555556;
  auVar37._16_4_ = auVar104._16_4_ + auVar10._16_4_ * 0.055555556;
  auVar37._20_4_ = auVar104._20_4_ + auVar10._20_4_ * 0.055555556;
  auVar37._24_4_ = auVar104._24_4_ + auVar10._24_4_ * 0.055555556;
  auVar37._28_4_ = auVar104._28_4_ + auVar10._28_4_;
  auVar10 = vmaxps_avx(auVar16,auVar37);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar10 = vminps_avx(auVar55,auVar95);
  auVar118._8_4_ = 0x7f800000;
  auVar118._0_8_ = 0x7f8000007f800000;
  auVar118._12_4_ = 0x7f800000;
  auVar118._16_4_ = 0x7f800000;
  auVar118._20_4_ = 0x7f800000;
  auVar118._24_4_ = 0x7f800000;
  auVar118._28_4_ = 0x7f800000;
  auVar55 = vminps_avx(auVar118,auVar100);
  auVar10 = vminps_avx(auVar55,auVar10);
  auVar55 = vminps_avx(auVar67,auVar101);
  auVar67 = vminps_avx(auVar118,auVar96);
  auVar55 = vminps_avx(auVar67,auVar55);
  auVar67 = vminps_avx(auVar118,auVar104);
  auVar16 = vminps_avx(auVar16,auVar37);
  auVar67 = vminps_avx(auVar67,auVar16);
  auVar16 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vmaxps_avx(auVar34,auVar16);
  auVar16 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar16);
  auVar27 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar15,auVar15,0xb1);
  auVar34 = vmaxps_avx(auVar15,auVar34);
  auVar15 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar15);
  auVar50 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar50 = vunpcklps_avx(auVar27,auVar50);
  auVar34 = vshufps_avx(auVar14,auVar14,0xb1);
  auVar34 = vmaxps_avx(auVar14,auVar34);
  auVar14 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar14);
  auVar27 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar27 = vinsertps_avx(auVar50,auVar27,0x28);
  auVar34 = vshufps_avx(auVar67,auVar67,0xb1);
  auVar34 = vminps_avx(auVar67,auVar34);
  auVar14 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar14);
  auVar50 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar34 = vminps_avx(auVar55,auVar34);
  auVar14 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar14);
  auVar24 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar24 = vunpcklps_avx(auVar50,auVar24);
  auVar34 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar34 = vminps_avx(auVar10,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar50 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar50 = vinsertps_avx(auVar24,auVar50,0x28);
  auVar34 = vshufps_avx(auVar90,auVar90,0xb1);
  auVar34 = vminps_avx(auVar90,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar24 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar66,auVar66,0xb1);
  auVar34 = vminps_avx(auVar66,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar25 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar25 = vunpcklps_avx(auVar24,auVar25);
  auVar34 = vshufps_avx(auVar54,auVar54,0xb1);
  auVar34 = vminps_avx(auVar54,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar24 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar24 = vinsertps_avx(auVar25,auVar24,0x28);
  auVar25 = vminps_avx(auVar50,auVar24);
  auVar34 = vshufps_avx(auVar12,auVar12,0xb1);
  auVar34 = vmaxps_avx(auVar12,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar50 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar11,auVar11,0xb1);
  auVar34 = vmaxps_avx(auVar11,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar24 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar24 = vunpcklps_avx(auVar50,auVar24);
  auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar34 = vmaxps_avx(auVar33,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar50 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar50 = vinsertps_avx(auVar24,auVar50,0x28);
  auVar24 = vmaxps_avx(auVar27,auVar50);
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  auVar27 = vandps_avx(auVar25,auVar65);
  auVar50 = vandps_avx(auVar24,auVar65);
  auVar27 = vmaxps_avx(auVar27,auVar50);
  auVar50 = vmovshdup_avx(auVar27);
  auVar50 = vmaxss_avx(auVar50,auVar27);
  auVar27 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vmaxss_avx(auVar27,auVar50);
  auVar27 = ZEXT416((uint)(auVar27._0_4_ * 4.7683716e-07));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar25,auVar27);
  (__return_storage_ptr__->lower).field_0 = aVar13;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar24._0_4_ + auVar27._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar24._4_4_ + auVar27._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar24._8_4_ + auVar27._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar24._12_4_ + auVar27._12_4_;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }